

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
pstore::small_vector<int,_3UL>::small_vector
          (small_vector<int,_3UL> *this,small_vector<int,_3UL> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int *__value;
  back_insert_iterator<pstore::small_vector<int,_3UL>_> local_30;
  
  this->elements_ = 0;
  (this->small_buffer_)._M_elems[0] = 0;
  (this->small_buffer_)._M_elems[1] = 0;
  (this->small_buffer_)._M_elems[2] = 0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->buffer_ = (this->small_buffer_)._M_elems;
  uVar1 = -(long)(this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  uVar2 = 3;
  if (3 < uVar1) {
    uVar2 = uVar1;
  }
  if (uVar2 < rhs->elements_) {
    std::vector<int,_std::allocator<int>_>::reserve(&this->big_buffer_,rhs->elements_);
  }
  __value = rhs->buffer_;
  if (0 < (long)rhs->elements_) {
    lVar3 = rhs->elements_ + 1;
    local_30.container = this;
    do {
      std::back_insert_iterator<pstore::small_vector<int,_3UL>_>::operator=(&local_30,__value);
      __value = __value + 1;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (small_vector const & rhs)
            : small_vector () {
        this->reserve (rhs.size ());
        std::copy (std::begin (rhs), std::end (rhs), std::back_inserter (*this));
    }